

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void os_score(int cur,int turncount)

{
  osgen_txtwin_t *win;
  int iVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  ulong __n;
  char buf [20];
  char acStack_78 [72];
  
  win = S_status_win;
  if (turncount != -1) {
    sprintf(&stack0xffffffffffffffd8,"%d/%d",cur,(ulong)(uint)turncount);
    os_strsc(&stack0xffffffffffffffd8);
    return;
  }
  if (S_stat_reset_free != (char *)0x0 && S_status_win != (osgen_txtwin_t *)0x0) {
    S_status_win->txtfree = S_stat_reset_free;
    iVar1 = S_stat_reset_x;
    (win->base).x = S_stat_reset_x;
    iVar4 = (int)(win->base).wid;
    iVar3 = iVar4 - iVar1;
    if (iVar1 <= iVar4) {
      sVar2 = strlen(S_scorebuf);
      iVar4 = (int)sVar2 + 1;
      if (iVar4 < iVar3) {
        for (; iVar4 < iVar3; iVar3 = iVar3 - (int)__n) {
          __n = (long)iVar3 + ~sVar2;
          if (0x3e < (long)iVar3 + ~sVar2) {
            __n = 0x3f;
          }
          memset(acStack_78,0x20,__n);
          ossaddsb(win,acStack_78,__n,1);
        }
        sVar2 = strlen(S_scorebuf);
      }
      else {
        ossaddsb(win," ",1,1);
        sVar2 = strlen(S_scorebuf);
      }
      ossaddsb(win,S_scorebuf,sVar2,1);
      return;
    }
  }
  return;
}

Assistant:

void os_score(int cur, int turncount)
{
    char buf[20];

    /* check for the special -1 turn count */
    if (turncount == -1)
    {
        /* it's turn "-1" - we're simply redrawing the score */
        os_strsc((char *)0);
    }
    else
    {
        /* format the score */
        sprintf(buf, "%d/%d", cur, turncount);

        /* display the score string */
        os_strsc(buf);
    }
}